

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void opengv::absolute_pose::modules::p3p_gao_main
               (bearingVectors_t *f,points_t *points,transformations_t *solutions)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pointer pMVar5;
  RhsNested pMVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  size_t i;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Scalar SVar32;
  Scalar SVar33;
  Scalar SVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  double dVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  double dVar68;
  undefined1 auVar65 [32];
  double dVar67;
  double dVar69;
  undefined1 auVar66 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  points_t p_cam;
  vector<double,_std::allocator<double>_> x_temp;
  Matrix<double,_4,_1,_0,_4,_1> x;
  Matrix<double,_4,_1,_0,_4,_1> v;
  transformation_t solution;
  bearingVector_t f3;
  bearingVector_t f2;
  Matrix<double,_4,_1,_0,_4,_1> Z;
  Matrix<double,_4,_1,_0,_4,_1> Y;
  Matrix<double,_4,_1,_0,_4,_1> X;
  Matrix<double,_4,_1,_0,_4,_1> b1_part2;
  Matrix<double,_4,_1,_0,_4,_1> b1_part1;
  Matrix<double,_4,_1,_0,_4,_1> ones;
  Matrix<double,_4,_1,_0,_4,_1> tempXP3;
  Matrix<double,_4,_1,_0,_4,_1> tempXP2;
  Matrix<double,_5,_1,_0,_5,_1> factors;
  bearingVector_t f1;
  Vector3d tempp;
  point_t C;
  point_t B;
  point_t A;
  Matrix<double,_4,_1,_0,_4,_1> tempXY;
  Matrix<double,_4,_1,_0,_4,_1> tempYP2;
  double local_5c0;
  double local_5b0;
  double local_5a0;
  ulong local_570;
  undefined8 local_540;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  _Vector_base<double,_std::allocator<double>_> local_518;
  double local_500 [4];
  double local_4e0;
  double local_4d8;
  double local_4d0;
  double *local_4c8;
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
  *local_470;
  Matrix<double,_3,_1,_0,_3,_1> *local_468;
  RhsNested local_450;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
  *local_448;
  Matrix<double,_3,_1,_0,_3,_1> local_3a0;
  Matrix<double,_3,_1,_0,_3,_1> local_380;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_360 [16];
  undefined8 uStack_350;
  undefined8 *puStack_348;
  double local_320 [4];
  double local_300 [4];
  double local_2e0;
  double dStack_2d8;
  double dStack_2d0;
  double dStack_2c8;
  double local_2c0;
  double dStack_2b8;
  double dStack_2b0;
  double dStack_2a8;
  undefined8 local_2a0 [4];
  double local_280;
  double dStack_278;
  double dStack_270;
  double dStack_268;
  Matrix<double,_3,_1,_0,_3,_1> local_260;
  double dStack_248;
  double local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  Matrix<double,_3,_1,_0,_3,_1> local_210;
  Matrix<double,_3,_1,_0,_3,_1> local_1f0;
  Matrix<double,_3,_1,_0,_3,_1> local_1d0;
  Matrix<double,_3,_1,_0,_3,_1> local_1b0;
  Matrix<double,_3,_1,_0,_3,_1> local_190;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_178 [24];
  double local_160;
  double dStack_158;
  double dStack_150;
  undefined8 *puStack_148;
  double *local_140;
  undefined8 local_120;
  Matrix<double,_3,_1,_0,_3,_1> *local_118;
  undefined1 local_100 [16];
  double dStack_f0;
  double dStack_e8;
  scalar_constant_op<double> local_e0;
  LhsNested local_c0 [9];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  pMVar5 = (points->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data + 0x10);
  local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
       [0];
  local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data + 8);
  local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&pMVar5[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data + 0x10);
  local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       pMVar5[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0];
  local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&pMVar5[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data + 8);
  local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&pMVar5[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data + 0x10);
  local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       pMVar5[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0];
  local_1d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&pMVar5[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data + 8);
  local_480._0_8_ = &local_190;
  local_480._8_8_ = &local_1b0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (&local_1f0,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_480);
  dVar13 = local_1f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
  dVar7 = local_1f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1];
  dVar10 = local_1f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
  local_480._0_8_ = &local_1b0;
  local_480._8_8_ = &local_1d0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (&local_1f0,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_480);
  dVar14 = local_1f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
  dVar12 = local_1f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
  dVar11 = local_1f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
  local_480._0_8_ = &local_190;
  local_480._8_8_ = &local_1d0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (&local_1f0,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_480);
  pMVar5 = (f->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_210.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data + 0x10);
  local_210.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
       [0];
  local_210.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data + 8);
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&pMVar5[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data + 0x10);
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       pMVar5[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&pMVar5[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data + 8);
  local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&pMVar5[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data + 0x10);
  local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       pMVar5[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0];
  local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&pMVar5[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data + 8);
  local_480._0_8_ = &local_380;
  local_480._8_8_ = &local_3a0;
  SVar32 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_480);
  local_480._0_8_ = &local_210;
  local_480._8_8_ = &local_3a0;
  SVar33 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_480);
  local_480._0_8_ = &local_210;
  local_480._8_8_ = &local_380;
  SVar34 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_480);
  pMVar6 = (RhsNested)(SVar34 + SVar34);
  dVar69 = (double)pMVar6 * (double)pMVar6;
  dVar54 = SVar32 + SVar32;
  dVar8 = dVar54 * dVar54;
  dVar67 = SVar33 + SVar33;
  dVar9 = dVar67 * dVar67;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar69 + dVar8 + dVar9;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = pMVar6;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar67 * dVar54;
  auVar25 = vfnmadd231sd_fma(auVar25,auVar29,auVar70);
  dVar68 = auVar25._0_8_ + -1.0;
  if ((dVar68 != 0.0) || (NAN(dVar68))) {
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar13 * dVar13 + dVar10 * dVar10 + dVar7 * dVar7;
    auVar70 = vsqrtpd_avx(auVar24);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar14 * dVar14 + dVar11 * dVar11 + dVar12 * dVar12;
    auVar25 = vsqrtpd_avx(auVar31);
    auVar26._8_8_ = 0;
    auVar26._0_8_ =
         local_1f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2] *
         local_1f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2] +
         local_1f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0] *
         local_1f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0] +
         local_1f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1] *
         local_1f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
    auVar24 = vsqrtpd_avx(auVar26);
    auVar25 = vdivpd_avx(auVar25,auVar70);
    auVar129._0_8_ = auVar25._0_8_ * auVar25._0_8_;
    auVar129._8_8_ = auVar25._8_8_ * auVar25._8_8_;
    auVar25 = vdivpd_avx(auVar24,auVar70);
    dVar68 = auVar129._0_8_ * auVar129._0_8_;
    auVar136._0_8_ = auVar25._0_8_ * auVar25._0_8_;
    auVar136._8_8_ = auVar25._8_8_ * auVar25._8_8_;
    auVar31 = ZEXT816(0xc000000000000000);
    dVar10 = auVar136._0_8_ * auVar136._0_8_;
    auVar24 = vaddsd_avx512f(auVar136,auVar136);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar10;
    auVar25 = vfmadd213sd_fma(auVar31,auVar136,auVar30);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = auVar136._0_8_ * dVar69;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar68 + auVar25._0_8_ + 1.0;
    auVar25 = vfnmadd231sd_fma(auVar28,auVar27,auVar129);
    auVar25 = vfmadd231sd_avx512f(auVar25,auVar24,auVar129);
    auVar25 = vfmadd231sd_fma(auVar25,auVar129,auVar31);
    local_238 = auVar25._0_8_;
    if ((local_238 != 0.0) || (NAN(local_238))) {
      auVar137._8_8_ = 0;
      auVar137._0_8_ = dVar68;
      auVar26 = vaddsd_avx512f(auVar137,auVar137);
      auVar19._8_8_ = 0x8000000000000000;
      auVar19._0_8_ = 0x8000000000000000;
      auVar27 = vxorpd_avx512vl(auVar27,auVar19);
      auVar28 = vmulsd_avx512f(auVar129,ZEXT816(0x4010000000000000));
      auVar128._8_8_ = 0;
      auVar128._0_8_ = dVar54;
      auVar20._8_8_ = 0x8000000000000000;
      auVar20._0_8_ = 0x8000000000000000;
      auVar29 = vxorpd_avx512vl(auVar29,auVar20);
      auVar115._8_8_ = 0;
      auVar115._0_8_ = pMVar6;
      auVar101._8_8_ = 0;
      auVar101._0_8_ = dVar8;
      auVar21._8_8_ = 0x8000000000000000;
      auVar21._0_8_ = 0x8000000000000000;
      auVar30 = vxorpd_avx512vl(auVar30,auVar21);
      auVar121._8_8_ = 0;
      auVar121._0_8_ = dVar67;
      auVar132._8_8_ = 0;
      auVar132._0_8_ = dVar10;
      vmovsd_avx512f(auVar24);
      auVar25 = vmulsd_avx512f(auVar121,auVar26);
      vmovsd_avx512f(auVar26);
      auVar79._8_8_ = 0;
      auVar79._0_8_ = dVar67 * auVar136._0_8_ * -2.0;
      auVar25 = vfmsub231sd_fma(auVar25,auVar129,auVar79);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = dVar67 * auVar136._0_8_ * dVar69;
      auVar25 = vfmadd213sd_fma(auVar71,auVar129,auVar25);
      vmovsd_avx512f(auVar28);
      dVar11 = dVar54 * auVar136._0_8_ * (double)pMVar6;
      auVar25 = vfmadd231sd_fma(auVar25,auVar121,auVar31);
      auVar25 = vfmadd231sd_avx512f(auVar25,auVar24,auVar121);
      auVar25 = vfmadd231sd_avx512f(auVar25,auVar28,auVar121);
      auVar80._8_8_ = 0;
      auVar80._0_8_ = auVar136._0_8_ * dVar54;
      auVar25 = vfmadd231sd_fma(auVar25,auVar80,auVar115);
      auVar92._8_8_ = 0;
      auVar92._0_8_ = dVar11;
      auVar25 = vfmadd231sd_fma(auVar25,auVar92,auVar129);
      auVar102._8_8_ = 0;
      auVar102._0_8_ = (double)pMVar6 * auVar30._0_8_;
      auVar25 = vfmadd231sd_fma(auVar25,auVar102,auVar128);
      local_230 = auVar25._0_8_;
      auVar126._8_8_ = 0;
      auVar126._0_8_ = dVar69;
      auVar109._8_8_ = 0;
      auVar109._0_8_ = dVar9;
      auVar25 = vfmadd213sd_fma(auVar126,auVar132,auVar109);
      auVar25 = vfnmadd231sd_fma(auVar25,auVar136,auVar101);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = auVar136._0_8_ * auVar29._0_8_;
      auVar25 = vfmadd213sd_fma(auVar55,auVar115,auVar25);
      auVar25 = vfmadd231sd_fma(auVar25,auVar132,auVar101);
      auVar25 = vfmadd231sd_avx512f(auVar25,auVar27,auVar129);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = auVar25._0_8_ + 2.0;
      auVar25 = vfmadd231sd_fma(auVar56,auVar132,auVar31);
      auVar110._8_8_ = 0;
      auVar110._0_8_ = dVar54 * auVar136._0_8_ * auVar129._0_8_ * (double)pMVar6;
      auVar25 = vfnmadd213sd_fma(auVar110,auVar121,auVar25);
      auVar25 = vfmadd231sd_fma(auVar25,auVar137,ZEXT816(0x4000000000000000));
      auVar25 = vfmadd231sd_fma(auVar25,auVar129,ZEXT816(0xc010000000000000));
      auVar57._8_8_ = 0;
      auVar57._0_8_ = dVar9 * -2.0;
      auVar25 = vfmadd213sd_fma(auVar57,auVar129,auVar25);
      auVar25 = vfmadd231sd_fma(auVar25,auVar109,auVar137);
      local_228 = auVar25._0_8_;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = auVar129._0_8_ * dVar11;
      auVar25 = vfmadd231sd_fma(auVar58,auVar128,auVar102);
      auVar25 = vfnmadd231sd_avx512f(auVar25,auVar26,auVar121);
      auVar93._8_8_ = 0;
      auVar93._0_8_ = dVar8 * dVar67;
      auVar25 = vfmadd213sd_fma(auVar93,auVar136,auVar25);
      auVar29 = vmulsd_avx512f(auVar24,auVar121);
      auVar25 = vfmadd213sd_fma(auVar29,auVar129,auVar25);
      auVar122._8_8_ = 0;
      auVar122._0_8_ = dVar67;
      auVar25 = vfmadd231sd_avx512f(auVar25,auVar28,auVar122);
      auVar25 = vfmadd231sd_fma(auVar25,auVar115,auVar80);
      auVar25 = vfnmadd231sd_avx512f(auVar25,auVar24,auVar122);
      auVar29 = vfmadd231sd_fma(auVar25,auVar122,auVar31);
      auVar25 = vfmadd213sd_fma(auVar31,auVar129,ZEXT816(0x3ff0000000000000));
      local_220 = auVar29._0_8_;
      auVar25 = vfmadd231sd_fma(auVar25,auVar136,ZEXT816(0x4000000000000000));
      auVar35._8_8_ = 0;
      auVar35._0_8_ = dVar10 + auVar25._0_8_;
      auVar25 = vfnmadd231sd_fma(auVar35,auVar136,auVar101);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = dVar68 + auVar25._0_8_;
      auVar25 = vfnmadd231sd_avx512f(auVar36,auVar24,auVar129);
      local_218 = auVar25._0_8_;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Matrix<double,5,1,0,5,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_480,
                 (DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)&local_238);
      math::o4_roots((vector<double,_std::allocator<double>_> *)&local_518,(MatrixXd *)local_480);
      Eigen::internal::handmade_aligned_free((void *)local_480._0_8_);
      for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
        local_500[lVar23] = local_518._M_impl.super__Vector_impl_data._M_start[lVar23];
      }
      lVar23 = 0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = dVar8;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = auVar129._0_8_ + -1.0 + auVar136._0_8_;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = (double)pMVar6 * dVar67 * dVar54;
      auVar25 = vfmadd231sd_fma(auVar72,auVar37,auVar1);
      auVar22._8_8_ = 0x8000000000000000;
      auVar22._0_8_ = 0x8000000000000000;
      auVar29 = vxorpd_avx512vl(auVar121,auVar22);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = dVar54;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = auVar129._0_8_ * dVar67 * (double)pMVar6;
      auVar25 = vfnmadd132sd_fma(auVar81,auVar25,auVar2);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = dVar69;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = (auVar129._0_8_ + -1.0) - auVar136._0_8_;
      auVar25 = vfmadd132sd_fma(auVar59,auVar25,auVar3);
      dVar11 = auVar25._0_8_ * auVar136._0_8_ * auVar25._0_8_;
      local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = local_500[0] * local_500[0];
      local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = local_500[1] * local_500[1];
      local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = local_500[2] * local_500[2];
      dStack_248 = local_500[3] * local_500[3];
      local_280 = local_500[0] *
                  local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0];
      dStack_278 = local_500[1] *
                   local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1];
      dStack_270 = local_500[2] *
                   local_260.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2];
      dStack_268 = local_500[3] * dStack_248;
      for (; lVar23 != 4; lVar23 = lVar23 + 1) {
        local_2a0[lVar23] = 0x3ff0000000000000;
      }
      auVar25 = vfmadd231sd_fma(auVar29,auVar121,auVar129);
      dStack_e8 = (1.0 - auVar129._0_8_) - auVar136._0_8_;
      dStack_150 = (1.0 - auVar129._0_8_) + auVar136._0_8_;
      local_c0[0]._0_8_ = auVar25._0_8_;
      puStack_148 = local_2a0;
      local_e0.m_other = (double)&local_260;
      local_c0[0].m_functor.m_other = (double)local_500;
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
      ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                   *)local_480,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
                   *)local_100,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                   *)&local_160);
      Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)&local_2c0,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                  *)local_480);
      auVar127._8_8_ = 0;
      auVar127._0_8_ = pMVar6;
      auVar130._8_8_ = 0;
      auVar130._0_8_ = dVar69;
      auVar133._8_8_ = 0;
      auVar133._0_8_ = dVar68;
      auVar24 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
      local_140 = &local_280;
      dVar12 = (double)pMVar6 * dVar69;
      local_5c0 = auVar27._0_8_;
      auVar139._8_8_ = 0;
      auVar139._0_8_ = dVar54;
      auVar25 = vmulsd_avx512f(auVar133,auVar139);
      dVar7 = auVar129._0_8_ + auVar129._0_8_;
      auVar140._8_8_ = 0;
      auVar140._0_8_ = dVar54;
      auVar31 = vaddsd_avx512f(auVar139,auVar140);
      dVar13 = dVar69 * auVar25._0_8_;
      auVar123._8_8_ = 0;
      auVar123._0_8_ = dVar13;
      auVar29 = vfmadd213sd_avx512f(auVar130,auVar140,auVar123);
      auVar124._8_8_ = 0;
      auVar124._0_8_ = local_5a0;
      dVar14 = dVar67 * dVar12 * local_5b0;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = dVar12;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = auVar129._0_8_ * dVar12 * local_5b0;
      auVar25 = vfmadd231sd_fma(auVar94,auVar133,auVar38);
      auVar82._8_8_ = 0;
      auVar82._0_8_ = dVar14;
      auVar29 = vfnmadd231sd_fma(auVar29,auVar82,auVar129);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = dVar12 * local_5c0;
      auVar25 = vfmadd231sd_fma(auVar25,auVar60,auVar129);
      auVar73._8_8_ = 0;
      auVar73._0_8_ = dVar7;
      auVar25 = vfnmadd231sd_fma(auVar25,auVar73,auVar38);
      dVar15 = auVar136._0_8_ * (dVar12 + dVar12);
      auVar103._8_8_ = 0;
      auVar103._0_8_ = dVar12 + auVar25._0_8_;
      auVar25 = vfmadd231sd_fma(auVar103,auVar132,auVar38);
      auVar95._8_8_ = 0;
      auVar95._0_8_ = dVar12 + dVar12;
      auVar26 = vxorpd_avx512vl(auVar95,auVar24);
      auVar83._8_8_ = 0;
      auVar83._0_8_ = dVar15;
      auVar29 = vfmadd231sd_fma(auVar29,auVar83,auVar121);
      auVar25 = vfnmadd231sd_fma(auVar25,auVar95,auVar136);
      auVar29 = vfnmadd231sd_fma(auVar29,auVar121,auVar95);
      auVar84._8_8_ = 0;
      auVar84._0_8_ = auVar129._0_8_ + auVar136._0_8_;
      auVar27 = vmulsd_avx512f(auVar84,auVar31);
      puStack_148 = auVar25._0_8_;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = dVar69 * dVar69;
      auVar28 = vmulsd_avx512f(auVar140,auVar85);
      auVar25 = vfnmadd213sd_fma(auVar27,auVar130,auVar29);
      vmovsd_avx512f(auVar28);
      auVar104._8_8_ = 0;
      auVar104._0_8_ = dVar10 * dVar69 * dVar12;
      auVar144._8_8_ = 0;
      auVar144._0_8_ = dVar9;
      auVar29 = vfmadd231sd_avx512f(auVar104,auVar38,auVar144);
      auVar25 = vfmadd231sd_avx512f(auVar25,auVar28,auVar136);
      auVar111._8_8_ = 0;
      auVar111._0_8_ = local_5a0 * dVar12;
      auVar25 = vfmadd231sd_fma(auVar25,auVar111,auVar121);
      auVar112._8_8_ = 0;
      auVar112._0_8_ = auVar129._0_8_ * auVar136._0_8_ * dVar67 * dVar12;
      auVar25 = vfmadd213sd_fma(auVar112,auVar130,auVar25);
      dVar16 = dVar68 * auVar26._0_8_;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = dVar16;
      auVar25 = vfmadd231sd_fma(auVar25,auVar96,auVar121);
      auVar97._8_8_ = 0;
      auVar97._0_8_ = dVar69 + dVar69;
      auVar27 = vmulsd_avx512f(auVar140,auVar97);
      auVar116._8_8_ = 0;
      auVar116._0_8_ = auVar136._0_8_ * auVar27._0_8_;
      auVar25 = vfmadd213sd_fma(auVar116,auVar129,auVar25);
      auVar113._8_8_ = 0;
      auVar113._0_8_ = dVar10 * dVar69;
      auVar141._8_8_ = 0;
      auVar141._0_8_ = dVar54;
      auVar25 = vfmadd213sd_avx512f(auVar113,auVar141,auVar25);
      auVar25 = vfnmadd231sd_avx512f(auVar25,auVar28,auVar132);
      local_120 = auVar25._0_8_;
      auVar142._8_8_ = 0;
      auVar142._0_8_ = dVar8;
      auVar28 = vmulsd_avx512f(auVar142,auVar127);
      auVar25 = vfmadd231sd_fma(auVar29,auVar28,auVar132);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = dVar12;
      auVar25 = vfnmadd231sd_fma(auVar25,auVar39,auVar124);
      auVar143._8_8_ = 0;
      auVar143._0_8_ = dVar8;
      local_4a0 = vaddsd_avx512f(auVar142,auVar143);
      auVar117._8_8_ = 0;
      auVar117._0_8_ = dVar12 * dVar7;
      auVar25 = vfnmadd213sd_avx512f(auVar117,auVar144,auVar25);
      auVar145._8_8_ = 0;
      auVar145._0_8_ = dVar9;
      auVar29 = vmulsd_avx512f(auVar145,auVar39);
      auVar25 = vfmadd213sd_fma(auVar29,auVar133,auVar25);
      auVar118._8_8_ = 0;
      auVar118._0_8_ =
           local_1f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
      auVar25 = vfmadd213sd_fma(auVar118,auVar39,auVar25);
      auVar105._8_8_ = 0;
      auVar105._0_8_ = dVar10 * -2.0;
      auVar25 = vfmadd231sd_fma(auVar25,auVar105,auVar39);
      local_490 = vxorpd_avx512vl(local_4a0,auVar24);
      dVar17 = auVar136._0_8_ * local_490._0_8_;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = dVar17;
      auVar25 = vfmadd231sd_fma(auVar25,auVar106,auVar127);
      auVar29 = vmulsd_avx512f(auVar141,ZEXT816(0x4010000000000000));
      dVar18 = auVar129._0_8_ * auVar29._0_8_;
      auVar107._8_8_ = 0;
      auVar107._0_8_ = dVar69 * dVar18;
      auVar25 = vfmadd213sd_fma(auVar107,auVar121,auVar25);
      auVar29 = vmulsd_avx512f(auVar73,auVar143);
      auVar119._8_8_ = 0;
      auVar119._0_8_ = (double)pMVar6 * auVar29._0_8_;
      auVar25 = vfmadd213sd_fma(auVar119,auVar136,auVar25);
      auVar74._8_8_ = 0;
      auVar74._0_8_ = auVar136._0_8_ * dVar67 * dVar69 * dVar7;
      auVar25 = vfnmadd213sd_avx512f(auVar74,auVar141,auVar25);
      auVar108._8_8_ = 0;
      auVar108._0_8_ = auVar129._0_8_ * local_4a0._0_8_;
      auVar25 = vfnmadd213sd_fma(auVar108,auVar127,auVar25);
      auVar29 = vmulsd_avx512f(auVar121,auVar31);
      auVar25 = vfmadd231sd_avx512f(auVar25,auVar127,auVar143);
      auVar25 = vfmadd231sd_fma(auVar25,auVar129,auVar60);
      auVar30 = vmulsd_avx512f(auVar31,auVar130);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = auVar136._0_8_ * auVar30._0_8_;
      auVar25 = vfmadd213sd_fma(auVar61,auVar121,auVar25);
      auVar25 = vfmadd231sd_fma(auVar25,auVar133,auVar28);
      auVar25 = vfnmadd213sd_fma(auVar29,auVar130,auVar25);
      auVar25 = vfmadd231sd_fma(auVar25,auVar39,ZEXT816(0x4000000000000000));
      auVar40._8_8_ = 0;
      auVar40._0_8_ = dVar68 * auVar27._0_8_;
      auVar25 = vfnmadd213sd_fma(auVar40,auVar121,auVar25);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = auVar136._0_8_ * dVar67 * dVar69 * dVar69;
      auVar25 = vfnmadd213sd_avx512f(auVar62,auVar141,auVar25);
      local_4d0 = auVar25._0_8_;
      local_4c8 = local_500;
      local_118 = &local_260;
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
      ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                   *)local_100,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
                   *)&local_160,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                   *)&local_4e0);
      auVar120._8_8_ = 0;
      auVar120._0_8_ = dVar69;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = dVar54;
      auVar131._8_8_ = 0;
      auVar131._0_8_ = dVar9;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = local_5a0 * dVar12;
      auVar114._8_8_ = 0;
      auVar114._0_8_ = dVar18;
      auVar138._8_8_ = 0;
      auVar138._0_8_ = pMVar6;
      auVar134._8_8_ = 0;
      auVar134._0_8_ = local_570;
      auVar125._8_8_ = 0;
      auVar125._0_8_ = dVar68;
      local_5a0 = auVar24._0_8_;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = dVar9 * dVar54 * dVar69;
      auVar25 = vfmadd213sd_fma(auVar86,auVar121,auVar63);
      auVar75._8_8_ = 0;
      auVar75._0_8_ = auVar136._0_8_ * dVar54 * (double)local_4a0._0_8_;
      auVar25 = vfmadd213sd_fma(auVar75,auVar129,auVar25);
      auVar87._8_8_ = 0;
      auVar87._0_8_ = dVar15;
      auVar25 = vfnmadd213sd_fma(auVar114,auVar120,auVar25);
      auVar25 = vfnmadd213sd_fma(auVar87,auVar121,auVar25);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = dVar67 * (double)local_490._0_8_;
      auVar25 = vfmadd213sd_fma(auVar76,auVar138,auVar25);
      auVar88._8_8_ = 0;
      auVar88._0_8_ = dVar69 * dVar10 * -2.0;
      auVar25 = vfmadd213sd_fma(auVar88,auVar98,auVar25);
      auVar25 = vfmadd213sd_fma(auVar134,auVar136,auVar25);
      auVar89._8_8_ = 0;
      auVar89._0_8_ = dVar16;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = dVar68 * auVar31._0_8_;
      auVar25 = vfmadd213sd_fma(auVar77,auVar120,auVar25);
      auVar135._8_8_ = 0;
      auVar135._0_8_ = dVar8;
      auVar25 = vfmadd213sd_fma(auVar89,auVar121,auVar25);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = dVar54 * (double)local_4a0._0_8_;
      auVar25 = vfnmadd231sd_fma(auVar25,auVar64,auVar129);
      auVar78._8_8_ = 0;
      auVar78._0_8_ = dVar8 * dVar54;
      auVar25 = vfmadd231sd_fma(auVar25,auVar78,auVar125);
      auVar25 = vfmadd231sd_fma(auVar25,auVar120,auVar31);
      auVar25 = vfmadd231sd_fma(auVar25,auVar135,auVar98);
      auVar99._8_8_ = 0;
      auVar99._0_8_ = dVar14;
      auVar25 = vfmadd213sd_fma(auVar99,auVar129,auVar25);
      auVar90._8_8_ = 0;
      auVar90._0_8_ = auVar136._0_8_ * dVar8 * (dVar67 + dVar67);
      auVar25 = vfmadd213sd_fma(auVar90,auVar138,auVar25);
      auVar100._8_8_ = 0;
      auVar100._0_8_ = (double)pMVar6 * auVar129._0_8_ * dVar67 * 4.0;
      auVar25 = vfmadd213sd_fma(auVar100,auVar135,auVar25);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = auVar129._0_8_ * (double)((ulong)auVar31._0_8_ ^ (ulong)local_5a0) * dVar69;
      auVar25 = vfmadd213sd_fma(auVar41,auVar131,auVar25);
      auVar91._8_8_ = 0;
      auVar91._0_8_ = (double)pMVar6 * dVar68 * (double)local_490._0_8_;
      auVar25 = vfmadd213sd_fma(auVar91,auVar121,auVar25);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = dVar13;
      auVar25 = vfmadd213sd_fma(auVar42,auVar131,auVar25);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = auVar26._0_8_;
      auVar25 = vfmadd231sd_fma(auVar25,auVar121,auVar4);
      auVar25 = vfnmadd231sd_fma(auVar25,auVar136,auVar64);
      auVar25 = vfmadd213sd_fma(auVar132,auVar78,auVar25);
      auVar43._8_8_ = 0;
      auVar43._0_8_ = dVar67 * (double)pMVar6 * dVar17;
      auVar25 = vfmadd213sd_fma(auVar43,auVar129,auVar25);
      uStack_350 = auVar25._0_8_;
      puStack_348 = local_2a0;
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
      ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                   *)local_480,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
                   *)local_100,local_360);
      Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)&local_2e0,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                  *)local_480);
      auVar65._8_8_ = dVar11;
      auVar65._0_8_ = dVar11;
      auVar65._16_8_ = dVar11;
      auVar65._24_8_ = dVar11;
      auVar48._0_8_ = local_2c0 * local_2e0;
      auVar48._8_8_ = dStack_2b8 * dStack_2d8;
      auVar48._16_8_ = dStack_2b0 * dStack_2d0;
      auVar48._24_8_ = dStack_2a8 * dStack_2c8;
      auVar48 = vdivpd_avx(auVar48,auVar65);
      dVar54 = auVar48._0_8_;
      local_160 = dVar54 * local_500[0];
      dVar67 = auVar48._8_8_;
      dStack_158 = dVar67 * local_500[1];
      dVar68 = auVar48._16_8_;
      dStack_150 = dVar68 * local_500[2];
      dVar69 = auVar48._24_8_;
      puStack_148 = (undefined8 *)(dVar69 * local_500[3]);
      local_100._0_8_ = dVar54 * dVar54;
      local_100._8_8_ = dVar67 * dVar67;
      dStack_f0 = dVar68 * dVar68;
      dStack_e8 = dVar69 * dVar69;
      local_480._8_8_ = &local_260;
      local_470 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
                   *)local_100;
      local_450 = pMVar6;
      local_448 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
                   *)&local_160;
      Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,4,1,0,4,1>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)&local_4e0,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                  *)local_480);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_4e0;
      if (local_4e0 < 0.0) {
        auVar50._0_8_ = sqrt(local_4e0);
        auVar50._8_56_ = extraout_var;
        auVar25 = auVar50._0_16_;
      }
      else {
        auVar25 = vsqrtsd_avx(auVar44,auVar44);
      }
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_4d8;
      if (local_4d8 < 0.0) {
        auVar51._0_8_ = sqrt(local_4d8);
        auVar51._8_56_ = extraout_var_00;
        auVar29 = auVar51._0_16_;
      }
      else {
        auVar29 = vsqrtsd_avx(auVar45,auVar45);
      }
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_4d0;
      if (local_4d0 < 0.0) {
        auVar52._0_8_ = sqrt(local_4d0);
        auVar52._8_56_ = extraout_var_01;
        auVar24 = auVar52._0_16_;
      }
      else {
        auVar24 = vsqrtsd_avx(auVar46,auVar46);
      }
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_4c8;
      if ((double)local_4c8 < 0.0) {
        auVar53._0_8_ = sqrt((double)local_4c8);
        auVar53._8_56_ = extraout_var_02;
        auVar31 = auVar53._0_16_;
      }
      else {
        auVar31 = vsqrtsd_avx(auVar47,auVar47);
      }
      local_540 = auVar70._0_8_;
      auVar70 = vunpcklpd_avx(auVar24,auVar31);
      lVar23 = 0;
      auVar25 = vunpcklpd_avx(auVar25,auVar29);
      auVar66._8_8_ = local_540;
      auVar66._0_8_ = local_540;
      auVar66._16_8_ = local_540;
      auVar66._24_8_ = local_540;
      auVar49._16_16_ = auVar70;
      auVar49._0_16_ = auVar25;
      _local_360 = vdivpd_avx(auVar66,auVar49);
      local_300[0] = local_360._0_8_ * local_500[0];
      local_300[1] = local_360._8_8_ * local_500[1];
      local_300[2] = local_360._16_8_ * local_500[2];
      local_300[3] = local_360._24_8_ * local_500[3];
      local_320[0] = dVar54 * local_360._0_8_;
      local_320[1] = dVar67 * local_360._8_8_;
      local_320[2] = dVar68 * local_360._16_8_;
      local_320[3] = dVar69 * local_360._24_8_;
      for (; lVar23 != 4; lVar23 = lVar23 + 1) {
        local_470 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
                     *)local_300[lVar23];
        local_520 = 0;
        local_530 = 0;
        uStack_528 = 0;
        local_468 = &local_210;
        Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                  (local_178,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)local_480);
        std::
        vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
                  ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                    *)&local_530,(Matrix<double,_3,_1,_0,_3,_1> *)local_178);
        local_470 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
                     *)local_320[lVar23];
        local_468 = &local_380;
        Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                  (local_178,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)local_480);
        std::
        vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
                  ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                    *)&local_530,(Matrix<double,_3,_1,_0,_3,_1> *)local_178);
        local_470 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
                     *)local_320[lVar23 + -8];
        local_468 = &local_3a0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                  (local_178,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)local_480);
        std::
        vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
                  ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                    *)&local_530,(Matrix<double,_3,_1,_0,_3,_1> *)local_178);
        math::arun_complete((transformation_t *)local_480,points,(points_t *)&local_530);
        std::
        vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
        ::push_back(solutions,(value_type *)local_480);
        std::
        _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::~_Vector_base((_Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         *)&local_530);
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_518);
    }
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::p3p_gao_main(
    const bearingVectors_t & f,
    const points_t & points,
    transformations_t & solutions )
{
  point_t A = points[0];
  point_t B = points[1];
  point_t C = points[2];

  Eigen::Vector3d tempp;
  tempp = A-B;
  double AB = tempp.norm();
  tempp = B-C;
  double BC = tempp.norm();
  tempp = A-C;
  double AC = tempp.norm();

  bearingVector_t f1 = f[0];
  bearingVector_t f2 = f[1];
  bearingVector_t f3 = f[2];

  double cosalpha = f2.transpose()*f3;
  double cosbeta = f1.transpose()*f3;
  double cosgamma = f1.transpose()*f2;

  double a=pow((BC/AB),2);
  double b=pow((AC/AB),2);
  double p=2*cosalpha;
  double q=2*cosbeta;
  double r=2*cosgamma;

  double aSq = a * a;
  double bSq = b * b;
  double pSq = p*p;
  double qSq = q*q;
  double rSq = r*r;

  if ((pSq + qSq + rSq - p*q*r - 1) == 0)
    return;

  Eigen::Matrix<double,5,1> factors;

  factors[0] = -2*b + bSq + aSq + 1 - b*rSq*a + 2*b*a - 2*a;

  if (factors[0] == 0)
    return;

  factors[1] =
      -2*b*q*a - 2*aSq*q + b*rSq*q*a - 2*q + 2*b*q +
      4*a*q + p*b*r + b*r*p*a - bSq*r*p;
  factors[2] =
      qSq + bSq*rSq - b*pSq - q*p*b*r + bSq*pSq - b*rSq*a +
      2 - 2*bSq - a*b*r*p*q + 2*aSq - 4*a - 2*qSq*a + qSq*aSq;
  factors[3] =
      -bSq*r*p + b*r*p*a - 2*aSq*q + q*pSq*b +
      2*b*q*a + 4*a*q + p*b*r - 2*b*q - 2*q;
  factors[4] = 1 - 2*a + 2*b + bSq - b*pSq + aSq - 2*b*a;

  std::vector<double> x_temp = math::o4_roots(factors);
  Eigen::Matrix<double,4,1> x;
  for( size_t i = 0; i < 4; i++ ) x[i] = x_temp[i];

  double temp = (pSq*(a-1+b) + p*q*r - q*a*r*p + (a-1-b)*rSq);
  double b0 = b * temp * temp;

  double rCb = rSq*r;

  Eigen::Matrix<double,4,1> tempXP2;
  tempXP2[0] = x[0]*x[0];
  tempXP2[1] = x[1]*x[1];
  tempXP2[2] = x[2]*x[2];
  tempXP2[3] = x[3]*x[3];
  Eigen::Matrix<double,4,1> tempXP3;
  tempXP3[0] = tempXP2[0]*x[0];
  tempXP3[1] = tempXP2[1]*x[1];
  tempXP3[2] = tempXP2[2]*x[2];
  tempXP3[3] = tempXP2[3]*x[3];

  Eigen::Matrix<double,4,1> ones;
  for( size_t i = 0; i < 4; i++) ones[i] = 1.0;

  Eigen::Matrix<double,4,1> b1_part1 =
      (1-a-b)*tempXP2 + (q*a-q)*x + (1 - a + b)*ones;

  Eigen::Matrix<double,4,1> b1_part2 =
      (aSq*rCb + 2*b*rCb*a - b*rSq*rCb*a - 2*a*rCb + rCb + bSq*rCb
      - 2*rCb*b)*tempXP3
      +(p*rSq + p*aSq*rSq - 2*b*rCb*q*a + 2*rCb*b*q - 2*rCb*q - 2*p*(a+b)*rSq
      + rSq*rSq*p*b + 4*a*rCb*q + b*q*a*rCb*rSq - 2*rCb*aSq*q +2*rSq*p*b*a
      + bSq*rSq*p - rSq*rSq*p*bSq)*tempXP2
      +(rCb*qSq + rSq*rCb*bSq + r*pSq*bSq - 4*a*rCb - 2*a*rCb*qSq + rCb*qSq*aSq
      + 2*aSq*rCb - 2*bSq*rCb - 2*pSq*b*r + 4*p*a*rSq*q + 2*a*pSq*r*b
      - 2*a*rSq*q*b*p - 2*pSq*a*r + r*pSq - b*rSq*rCb*a + 2*p*rSq*b*q
      + r*pSq*aSq -2*p*q*rSq + 2*rCb - 2*rSq*p*aSq*q - rSq*rSq*q*b*p)*x
      +(4*a*rCb*q + p*rSq*qSq + 2*pSq*p*b*a - 4*p*a*rSq - 2*rCb*b*q - 2*pSq*q*r
      - 2*bSq*rSq*p + rSq*rSq*p*b + 2*p*aSq*rSq - 2*rCb*aSq*q - 2*pSq*p*a
      + pSq*p*aSq + 2*p*rSq + pSq*p + 2*b*rCb*q*a + 2*q*pSq*b*r + 4*q*a*r*pSq
      - 2*p*a*rSq*qSq - 2*pSq*aSq*r*q + p*aSq*rSq*qSq - 2*rCb*q - 2*pSq*p*b
      + pSq*p*bSq - 2*pSq*b*r*q*a)*ones;

  Eigen::Matrix<double,4,1> b1;
  b1[0] = b1_part1[0]*b1_part2[0];
  b1[1] = b1_part1[1]*b1_part2[1];
  b1[2] = b1_part1[2]*b1_part2[2];
  b1[3] = b1_part1[3]*b1_part2[3];

  Eigen::Matrix<double,4,1> y=b1/b0;
  Eigen::Matrix<double,4,1> tempYP2;
  tempYP2[0] = pow(y[0],2);
  tempYP2[1] = pow(y[1],2);
  tempYP2[2] = pow(y[2],2);
  tempYP2[3] = pow(y[3],2);

  Eigen::Matrix<double,4,1> tempXY;
  tempXY[0] = x[0]*y[0];
  tempXY[1] = x[1]*y[1];
  tempXY[2] = x[2]*y[2];
  tempXY[3] = x[3]*y[3];

  Eigen::Matrix<double,4,1> v= tempXP2 + tempYP2 - r*tempXY;

  Eigen::Matrix<double,4,1> Z;
  Z[0] = AB/sqrt(v[0]);
  Z[1] = AB/sqrt(v[1]);
  Z[2] = AB/sqrt(v[2]);
  Z[3] = AB/sqrt(v[3]);

  Eigen::Matrix<double,4,1> X;
  X[0] = x[0]*Z[0];
  X[1] = x[1]*Z[1];
  X[2] = x[2]*Z[2];
  X[3] = x[3]*Z[3];

  Eigen::Matrix<double,4,1> Y;
  Y[0] = y[0]*Z[0];
  Y[1] = y[1]*Z[1];
  Y[2] = y[2]*Z[2];
  Y[3] = y[3]*Z[3];

  for( int i = 0; i < 4; i++ )
  {
    //apply arun to find the transformation
    points_t p_cam;
    p_cam.push_back(X[i]*f1);
    p_cam.push_back(Y[i]*f2);
    p_cam.push_back(Z[i]*f3);

    transformation_t solution = math::arun_complete(points,p_cam);
    solutions.push_back(solution);
  }
}